

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::DragBehaviorT<double,double,double>
               (ImGuiDataType data_type,double *v,float v_speed,double v_min,double v_max,
               char *format,float power,ImGuiDragFlags flags)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiInputSource IVar6;
  int decimal_precision;
  float *pfVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  float fVar14;
  float fVar15;
  double local_48;
  ImVec2 local_38;
  
  pIVar4 = GImGui;
  uVar8 = data_type & 0xfffffffe;
  bVar2 = false;
  if ((v_min < v_max) && (((bVar2 = false, power != 1.0 || (NAN(power))) && (uVar8 == 8)))) {
    bVar2 = v_max - v_min < 3.4028234663852886e+38;
  }
  if (v_max < v_min) {
    return false;
  }
  if (((v_speed == 0.0) && (!NAN(v_speed))) &&
     ((v_min < v_max && (v_max - v_min < 3.4028234663852886e+38)))) {
    v_speed = (float)((v_max - v_min) * (double)GImGui->DragSpeedDefaultRatio);
  }
  uVar9 = flags & 1;
  IVar6 = GImGui->ActiveIdSource;
  if (IVar6 == ImGuiInputSource_Mouse) {
    bVar5 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar5) || ((pIVar4->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
      IVar6 = pIVar4->ActiveIdSource;
      goto LAB_00180490;
    }
    pfVar7 = ImVec2::operator[](&(pIVar4->IO).MouseDelta,(ulong)uVar9);
    fVar15 = *pfVar7;
    if ((pIVar4->IO).KeyAlt != false) {
      fVar15 = fVar15 * 0.01;
    }
    if ((pIVar4->IO).KeyShift == true) {
      fVar15 = fVar15 * 10.0;
    }
  }
  else {
LAB_00180490:
    fVar15 = 0.0;
    if (IVar6 == ImGuiInputSource_Nav) {
      decimal_precision = 0;
      if (uVar8 == 8) {
        decimal_precision = ImParseFormatPrecision(format,3);
      }
      local_38 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      pfVar7 = ImVec2::operator[](&local_38,(ulong)uVar9);
      fVar15 = *pfVar7;
      fVar14 = GetMinimumStepAtDecimalPrecision(decimal_precision);
      v_speed = (float)((uint)v_speed & -(uint)(fVar14 <= v_speed) |
                       ~-(uint)(fVar14 <= v_speed) & (uint)fVar14);
    }
  }
  fVar15 = fVar15 * v_speed;
  fVar14 = fVar15;
  if (uVar9 != 0) {
    fVar14 = -fVar15;
  }
  if (v_min < v_max) {
    if ((*v < v_max) || (bVar5 = true, fVar14 <= 0.0)) {
      bVar5 = fVar14 < 0.0 && *v <= v_min;
    }
  }
  else {
    bVar5 = false;
  }
  if (bVar2) {
    if ((fVar14 < 0.0) && (0.0 < pIVar4->DragCurrentAccum)) goto LAB_001805db;
    if (fVar14 <= 0.0) goto LAB_001805a4;
    bVar3 = pIVar4->DragCurrentAccum <= 0.0 && pIVar4->DragCurrentAccum != 0.0;
  }
  else {
LAB_001805a4:
    bVar3 = false;
  }
  if (((pIVar4->ActiveIdIsJustActivated & 1U) == 0 && !bVar5) && (!bVar3)) {
    if ((fVar15 != 0.0) || (NAN(fVar15))) {
      pIVar4->DragCurrentAccum = pIVar4->DragCurrentAccum + fVar14;
      pIVar4->DragCurrentAccumDirty = true;
    }
    else if ((pIVar4->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    if (bVar2) {
      dVar13 = v_max - v_min;
      local_48 = pow((*v - v_min) / dVar13,1.0 / (double)power);
      fVar10 = (float)((double)pIVar4->DragCurrentAccum / dVar13 + local_48);
      fVar15 = 1.0;
      if (fVar10 <= 1.0) {
        fVar15 = fVar10;
      }
      fVar15 = powf((float)(~-(uint)(fVar10 < 0.0) & (uint)fVar15),power);
      dVar13 = (double)fVar15 * dVar13 + v_min;
    }
    else {
      dVar13 = *v + (double)pIVar4->DragCurrentAccum;
      local_48 = 0.0;
    }
    dVar13 = RoundScalarWithFormatT<double,double>(format,data_type,dVar13);
    pIVar4->DragCurrentAccumDirty = false;
    if (bVar2) {
      dVar1 = pow((dVar13 - v_min) / (v_max - v_min),1.0 / (double)power);
      pIVar4->DragCurrentAccum = pIVar4->DragCurrentAccum - (float)(dVar1 - local_48);
      uVar11 = SUB84(*v,0);
      uVar12 = (undefined4)((ulong)*v >> 0x20);
    }
    else {
      dVar1 = *v;
      uVar11 = SUB84(dVar1,0);
      uVar12 = (undefined4)((ulong)dVar1 >> 0x20);
      pIVar4->DragCurrentAccum = pIVar4->DragCurrentAccum - (float)(dVar13 - dVar1);
    }
    dVar13 = (double)(~-(ulong)(dVar13 == 0.0) & (ulong)dVar13);
    if (v_min < v_max) {
      if (((double)CONCAT44(uVar12,uVar11) != dVar13) ||
         (NAN((double)CONCAT44(uVar12,uVar11)) || NAN(dVar13))) {
        if ((dVar13 < v_min) ||
           (((uVar8 != 8 &&
             ((double)CONCAT44(uVar12,uVar11) <= dVar13 && dVar13 != (double)CONCAT44(uVar12,uVar11)
             )) && (fVar14 < 0.0)))) {
          dVar13 = v_min;
        }
        if ((v_max < dVar13) ||
           (((uVar8 != 8 &&
             (dVar13 <= (double)CONCAT44(uVar12,uVar11) && (double)CONCAT44(uVar12,uVar11) != dVar13
             )) && (0.0 < fVar14)))) {
          dVar13 = v_max;
        }
      }
    }
    if (((double)CONCAT44(uVar12,uVar11) == dVar13) &&
       (!NAN((double)CONCAT44(uVar12,uVar11)) && !NAN(dVar13))) {
      return false;
    }
    *v = dVar13;
    return true;
  }
LAB_001805db:
  pIVar4->DragCurrentAccum = 0.0;
  pIVar4->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_power = (power != 1.0f && is_decimal && is_clamped && (v_max - v_min < FLT_MAX));
    const bool is_locked = (v_min > v_max);
    if (is_locked)
        return false;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (SIGNEDTYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}